

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocatorTest.cpp
# Opt level: O3

Utest * __thiscall
TEST_FailableMemoryAllocator_FailSecondAndFourthMalloc_TestShell::createTest
          (TEST_FailableMemoryAllocator_FailSecondAndFourthMalloc_TestShell *this)

{
  TEST_FailableMemoryAllocator_FailSecondAndFourthMalloc_Test *this_00;
  
  this_00 = (TEST_FailableMemoryAllocator_FailSecondAndFourthMalloc_Test *)
            operator_new(0x70,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestMemoryAllocatorTest.cpp"
                         ,0xf6);
  TEST_FailableMemoryAllocator_FailSecondAndFourthMalloc_Test::
  TEST_FailableMemoryAllocator_FailSecondAndFourthMalloc_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(FailableMemoryAllocator, FailSecondAndFourthMalloc)
{
    failableMallocAllocator->failAllocNumber(2);
    failableMallocAllocator->failAllocNumber(4);
    int *memory1 = (int*)malloc(sizeof(int));
    int *memory2 = (int*)malloc(sizeof(int));
    int *memory3 = (int*)malloc(sizeof(int));
    int *memory4 = (int*)malloc(sizeof(int));

    CHECK(NULLPTR != memory1);
    POINTERS_EQUAL(NULLPTR, memory2);
    CHECK(NULLPTR != memory3);
    POINTERS_EQUAL(NULLPTR, memory4);

    free(memory1);
    free(memory3);
}